

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O0

void __thiscall
anon_unknown.dwarf_14966d::ThrowingErrorReporter::addError
          (ThrowingErrorReporter *this,uint32_t startByte,uint32_t endByte,StringPtr message)

{
  String *__return_storage_ptr__;
  String local_48;
  Fault local_30;
  Fault f;
  uint32_t endByte_local;
  uint32_t startByte_local;
  ThrowingErrorReporter *this_local;
  StringPtr message_local;
  
  message_local.content.ptr = (char *)message.content.size_;
  this_local = (ThrowingErrorReporter *)message.content.ptr;
  __return_storage_ptr__ = &local_48;
  f.exception._0_4_ = endByte;
  f.exception._4_4_ = startByte;
  kj::
  str<kj::StringPtr&,char_const(&)[3],unsigned_int&,char_const(&)[2],unsigned_int&,char_const(&)[3]>
            (__return_storage_ptr__,(kj *)&this_local,(StringPtr *)" (",
             (char (*) [3])((long)&f.exception + 4),(uint *)0x54fc50,(char (*) [2])&f,
             (uint *)0x525e41,(char (*) [3])__return_storage_ptr__);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::String>
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
             ,0x26,FAILED,(char *)0x0,"kj::str(message, \" (\", startByte, \":\", endByte, \").\")",
             __return_storage_ptr__);
  kj::String::~String(&local_48);
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
    KJ_FAIL_REQUIRE(kj::str(message, " (", startByte, ":", endByte, ")."));
  }